

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall
ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
          (basic_fstream<char,_std::char_traits<char>_> *this)

{
  std::ios::ios((ios *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x108);
  std::fstream::fstream((fstream *)this);
  *(undefined8 *)&this->super_basic_fstream<char,_std::char_traits<char>_> = 0x1b4a98;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x108 = 0x1b4ae8;
  *(undefined8 *)&(this->super_basic_fstream<char,_std::char_traits<char>_>).field_0x10 = 0x1b4ac0;
  return;
}

Assistant:

basic_fstream() {}